

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::bigint::assign_pow10(bigint *this,int exp)

{
  uint uVar1;
  uint in_ESI;
  bigint *in_RDI;
  int unaff_retaddr;
  bigint *in_stack_00000008;
  int bitmask;
  bigint *in_stack_00000120;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar3;
  
  uVar3 = CONCAT13(-1 < (int)in_ESI,in_stack_fffffffffffffff0);
  ignore_unused<bool,char[1]>((bool *)&stack0xfffffffffffffff3,(char (*) [1])0x1c61ba);
  if (in_ESI == 0) {
    assign((bigint *)(ulong)uVar3,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  else {
    for (iVar2 = 1; iVar2 <= (int)in_ESI; iVar2 = iVar2 << 1) {
    }
    uVar1 = iVar2 >> 1;
    assign((bigint *)CONCAT44(in_ESI,uVar3),CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    while (uVar1 = (int)uVar1 >> 1, uVar1 != 0) {
      square(in_stack_00000120);
      if ((in_ESI & uVar1) != 0) {
        operator*=(in_RDI,in_stack_ffffffffffffffdc);
      }
    }
    operator<<=(in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return assign(1);
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    assign(5);
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }